

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Def_AST_Node::eval_internal(Def_AST_Node *this,Dispatch_State *t_ss)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  Dispatch_Engine *a;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar4;
  reserved_word_error *e;
  name_conflict_error *e_1;
  value_type *func_node;
  string *l_annotation;
  string *l_function_name;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> guard;
  reference_wrapper<chaiscript::detail::Dispatch_Engine> engine;
  Param_Types param_types;
  AST_NodePtr guardnode;
  size_t numparams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t_param_names;
  Dispatch_Engine *in_stack_fffffffffffffcc8;
  anon_class_64_4_816528dd_for_m_f *in_stack_fffffffffffffcd0;
  anon_class_48_3_accba683_for_m_f *in_stack_fffffffffffffcd8;
  Dispatch_Engine *in_stack_fffffffffffffce0;
  shared_ptr<chaiscript::AST_Node> *in_stack_fffffffffffffce8;
  anon_class_64_4_816528dd_for_m_f *c;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *in_stack_fffffffffffffd10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd20;
  AST_NodePtr *t_node;
  Dispatch_State *in_stack_fffffffffffffd70;
  AST_NodePtr *in_stack_fffffffffffffd78;
  anon_class_64_4_816528dd_for_m_f local_1c8;
  const_reference local_180;
  byte local_172;
  allocator local_171;
  string local_170 [32];
  string *local_150;
  string *local_148;
  undefined4 local_13c;
  undefined8 local_138;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_130 [4];
  undefined8 local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8 [4];
  __shared_ptr local_48 [16];
  size_type local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x265636);
  local_38 = 0;
  std::shared_ptr<chaiscript::AST_Node>::shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x26564f);
  chaiscript::dispatch::Param_Types::Param_Types((Param_Types *)in_stack_fffffffffffffce0);
  sVar2 = std::
          vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60));
  if (2 < sVar2) {
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),1);
    peVar3 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x265691);
    if (peVar3->identifier == 8) {
      in_stack_fffffffffffffd20 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RSI + 0x60);
      t_node = (AST_NodePtr *)0x1;
      std::
      vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
      ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                    *)in_stack_fffffffffffffd20,1);
      peVar3 = std::
               __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2656c0);
      local_38 = std::
                 vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                 ::size(&peVar3->children);
      std::
      vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
      ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                    *)in_stack_fffffffffffffd20,(size_type)t_node);
      Arg_List_AST_Node::get_arg_names_abi_cxx11_(t_node);
      in_stack_fffffffffffffd18 = local_a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffce0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffcd8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffce0);
      std::
      vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
      ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                    *)(in_RSI + 0x60),1);
      Arg_List_AST_Node::get_arg_types(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      chaiscript::dispatch::Param_Types::operator=
                ((Param_Types *)in_stack_fffffffffffffcd0,(Param_Types *)in_stack_fffffffffffffcc8);
      chaiscript::dispatch::Param_Types::~Param_Types((Param_Types *)0x265768);
      sVar2 = std::
              vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
              ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                      *)(in_RSI + 0x60));
      if (3 < sVar2) {
        std::
        vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
        ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                      *)(in_RSI + 0x60),2);
        std::shared_ptr<chaiscript::AST_Node>::operator=
                  ((shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcd0,
                   (shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcc8);
      }
      goto LAB_0026581a;
    }
  }
  local_38 = 0;
  sVar2 = std::
          vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60));
  if (2 < sVar2) {
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),1);
    std::shared_ptr<chaiscript::AST_Node>::operator=
              ((shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcd0,
               (shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcc8);
  }
LAB_0026581a:
  chaiscript::detail::Dispatch_State::operator*((Dispatch_State *)0x265827);
  std::reference_wrapper<chaiscript::detail::Dispatch_Engine>::
  reference_wrapper<chaiscript::detail::Dispatch_Engine&,void,chaiscript::detail::Dispatch_Engine*>
            (&in_stack_fffffffffffffcd0->engine,in_stack_fffffffffffffcc8);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x265844);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_48);
  if (bVar1) {
    local_138 = local_e8;
    in_stack_fffffffffffffd10 = local_130;
    std::shared_ptr<chaiscript::AST_Node>::shared_ptr
              ((shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcd0,
               (shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcc8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_13c = (undefined4)local_38;
    chaiscript::dispatch::
    make_dynamic_proxy_function<chaiscript::eval::Def_AST_Node::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_1_,int,std::shared_ptr<chaiscript::AST_Node>&>
              (in_stack_fffffffffffffcd8,(int *)in_stack_fffffffffffffcd0,
               (shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcc8);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::operator=
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffcd0,
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffcc8);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x2658f2);
    const::
    {lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)#1}::
    ~vector((anon_class_48_3_accba683_for_m_f *)in_stack_fffffffffffffcd0);
  }
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 0x60),0);
  peVar3 = std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x265964);
  local_148 = &peVar3->text;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x78));
  local_172 = 0;
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x26599a);
    std::__cxx11::string::string(local_170,(string *)&peVar3->text);
  }
  else {
    std::allocator<char>::allocator();
    local_172 = 1;
    std::__cxx11::string::string(local_170,"",&local_171);
  }
  if ((local_172 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  local_150 = local_170;
  local_180 = std::
              vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
              ::back((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                      *)in_stack_fffffffffffffcd0);
  a = chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)0x265a35);
  c = &local_1c8;
  std::shared_ptr<chaiscript::AST_Node>::shared_ptr
            ((shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcd0,
             (shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcc8);
  std::shared_ptr<chaiscript::AST_Node>::shared_ptr
            ((shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcd0,
             (shared_ptr<chaiscript::AST_Node> *)in_stack_fffffffffffffcc8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::back((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          *)in_stack_fffffffffffffcd0);
  chaiscript::dispatch::
  make_dynamic_proxy_function<chaiscript::eval::Def_AST_Node::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_2_,int,std::shared_ptr<chaiscript::AST_Node>const&,chaiscript::dispatch::Param_Types&,std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>&>
            (c,(int *)a,in_stack_fffffffffffffce8,(Param_Types *)in_stack_fffffffffffffce0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8,in_stack_fffffffffffffd10);
  chaiscript::detail::Dispatch_Engine::add
            (in_stack_fffffffffffffce0,(Proxy_Function *)in_stack_fffffffffffffcd8,
             (string *)in_stack_fffffffffffffcd0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x265b1a);
  const::
  {lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)#2}::
  ~vector(in_stack_fffffffffffffcd0);
  std::__cxx11::string::~string(local_170);
  Boxed_Value::Boxed_Value((Boxed_Value *)0x265ed6);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x265ee5);
  chaiscript::dispatch::Param_Types::~Param_Types((Param_Types *)0x265ef2);
  std::shared_ptr<chaiscript::AST_Node>::~shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x265eff);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffce0);
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          std::vector<std::string> t_param_names;
          size_t numparams = 0;
          AST_NodePtr guardnode;

          dispatch::Param_Types param_types;

          if ((this->children.size() > 2) && (this->children[1]->identifier == AST_Node_Type::Arg_List)) {
            numparams = this->children[1]->children.size();
            t_param_names = Arg_List_AST_Node::get_arg_names(this->children[1]);
            param_types = Arg_List_AST_Node::get_arg_types(this->children[1], t_ss);

            if (this->children.size() > 3) {
              guardnode = this->children[2];
            }
          }
          else {
            //no parameters
            numparams = 0;

            if (this->children.size() > 2) {
              guardnode = this->children[1];
            }
          }

          std::reference_wrapper<chaiscript::detail::Dispatch_Engine> engine(*t_ss);
          std::shared_ptr<dispatch::Proxy_Function_Base> guard;
          if (guardnode) {
            guard = dispatch::make_dynamic_proxy_function(
                [engine, guardnode, t_param_names](const std::vector<Boxed_Value> &t_params)
                {
                  return detail::eval_function(engine, guardnode, t_param_names, t_params);
                },
                static_cast<int>(numparams), guardnode);
          }

          try {
            const std::string & l_function_name = this->children[0]->text;
            const std::string & l_annotation = this->annotation?this->annotation->text:"";
            const auto & func_node = this->children.back();
            t_ss->add(
                dispatch::make_dynamic_proxy_function(
                  [engine, guardnode, func_node, t_param_names](const std::vector<Boxed_Value> &t_params)
                  {
                    return detail::eval_function(engine, func_node, t_param_names, t_params);
                  },
                  static_cast<int>(numparams), this->children.back(),
                  param_types, l_annotation, guard), l_function_name);
          }
          catch (const exception::reserved_word_error &e) {
            throw exception::eval_error("Reserved word used as function name '" + e.word() + "'");
          } catch (const exception::name_conflict_error &e) {
            throw exception::eval_error("Function redefined '" + e.name() + "'");
          }
          return Boxed_Value();
        }